

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll_test.cc
# Opt level: O3

void __thiscall
vw_dll_parsed_and_constructed_example_parity::test_method
          (vw_dll_parsed_and_constructed_example_parity *this)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float *local_118;
  float *local_110;
  undefined8 local_108;
  undefined1 local_100 [8];
  undefined8 local_f8;
  shared_count sStack_f0;
  float score_constructed;
  float score_parsed;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  float **local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  float **local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  lVar1 = VW_InitializeA("-q st --noconstant --quiet");
  uVar2 = VW_ReadExampleA(lVar1,"1 |s p^the_man w^the w^man |t p^un_homme w^un w^homme");
  lVar3 = VW_InitializeA("-q st --noconstant --quiet");
  uVar4 = VW_InitializeFeatureSpaces(2);
  uVar5 = VW_GetFeatureSpace(uVar4,0);
  VW_InitFeatures(uVar5,3);
  uVar6 = VW_SetFeatureSpace(lVar3,uVar5,"s");
  uVar7 = VW_HashFeatureA(lVar3,"p^the_man",uVar6);
  VW_SetFeature(0x3f800000,uVar5,0,uVar7);
  uVar7 = VW_HashFeatureA(lVar3,"w^the",uVar6);
  VW_SetFeature(0x3f800000,uVar5,1,uVar7);
  uVar6 = VW_HashFeatureA(lVar3,"w^man",uVar6);
  VW_SetFeature(0x3f800000,uVar5,2,uVar6);
  uVar5 = VW_GetFeatureSpace(uVar4,1);
  VW_InitFeatures(uVar5,3);
  uVar6 = VW_SetFeatureSpace(lVar3,uVar5,"t");
  uVar7 = VW_HashFeatureA(lVar3,"p^un_homme",uVar6);
  VW_SetFeature(0x3f800000,uVar5,0,uVar7);
  uVar7 = VW_HashFeatureA(lVar3,"w^un",uVar6);
  VW_SetFeature(0x3f800000,uVar5,1,uVar7);
  uVar6 = VW_HashFeatureA(lVar3,"w^homme",uVar6);
  VW_SetFeature(0x3f800000,uVar5,2,uVar6);
  local_108 = uVar4;
  VW_ImportExample(lVar3,"1",uVar4,2);
  fVar8 = (float)VW_Learn(lVar1,uVar2);
  score_parsed = fVar8;
  fVar9 = (float)VW_Learn(lVar3,uVar2);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  score_constructed = fVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3a);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00308850;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_100[0] = fVar8 == fVar9;
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_98 = "";
  local_c8 = &local_110;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00308dc8;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_118;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_00308dc8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_118 = &score_constructed;
  local_110 = &score_parsed;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f0);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3e);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00308850;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_118 = (float *)(lVar3 + 0x3590);
  local_100[0] = *(char *)(lVar1 + 0x3590) == *(char *)(lVar3 + 0x3590);
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
  ;
  local_98 = "";
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_00308920;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_110;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_00308920;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_118;
  local_110 = (float *)(lVar1 + 0x3590);
  boost::test_tools::tt_detail::report_assertion
            (local_100,&local_70,&local_a0,0x3e,1,2,2,"vw1->weights.sparse",&local_e0,
             "vw2->weights.sparse",&local_c0);
  boost::detail::shared_count::~shared_count(&sStack_f0);
  if (*(char *)(lVar1 + 0x3590) == '\x01') {
    check_weights_equal<sparse_parameters>
              ((sparse_parameters *)(lVar1 + 0x35b0),(sparse_parameters *)(lVar3 + 0x35b0));
  }
  else {
    check_weights_equal<dense_parameters>
              ((dense_parameters *)(lVar1 + 0x3598),(dense_parameters *)(lVar3 + 0x3598));
  }
  VW_ReleaseFeatureSpace(local_108,2);
  VW_Finish(lVar1);
  VW_Finish(lVar3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(vw_dll_parsed_and_constructed_example_parity)
{
  //parse example
  VW_HANDLE handle1 = VW_InitializeA("-q st --noconstant --quiet");
  VW_EXAMPLE example_parsed;
  example_parsed = VW_ReadExampleA(handle1, "1 |s p^the_man w^the w^man |t p^un_homme w^un w^homme");

  //construct example
  VW_HANDLE handle2 = VW_InitializeA("-q st --noconstant --quiet");
  VW_EXAMPLE example_constructed;
  auto fs = VW_InitializeFeatureSpaces(2);

  auto first = VW_GetFeatureSpace(fs, 0);
  VW_InitFeatures(first, 3);
  auto shash = VW_SetFeatureSpace(handle2, first, "s");
  VW_SetFeature(first, 0, VW_HashFeatureA(handle2, "p^the_man", shash), 1.0f);
  VW_SetFeature(first, 1, VW_HashFeatureA(handle2, "w^the", shash), 1.0f);
  VW_SetFeature(first, 2, VW_HashFeatureA(handle2, "w^man", shash), 1.0f);

  auto second = VW_GetFeatureSpace(fs, 1);
  VW_InitFeatures(second, 3);
  auto thash = VW_SetFeatureSpace(handle2, second, "t");
  VW_SetFeature(second, 0, VW_HashFeatureA(handle2, "p^un_homme", thash), 1.0f);
  VW_SetFeature(second, 1, VW_HashFeatureA(handle2, "w^un", thash), 1.0f);
  VW_SetFeature(second, 2, VW_HashFeatureA(handle2, "w^homme", thash), 1.0f);

  example_constructed = VW_ImportExample(handle2, "1", fs, 2);


  // learn both
  auto score_parsed = VW_Learn(handle1, example_parsed);
  auto score_constructed = VW_Learn(handle2, example_parsed);


  //check parity
  BOOST_CHECK_EQUAL(score_parsed, score_constructed);
  auto vw1 = static_cast<vw*>(handle1);
  auto vw2 = static_cast<vw*>(handle2);

  BOOST_CHECK_EQUAL(vw1->weights.sparse, vw2->weights.sparse);

  if (vw1->weights.sparse) {
    check_weights_equal(vw1->weights.sparse_weights, vw2->weights.sparse_weights);
  }
  else {
    check_weights_equal(vw1->weights.dense_weights, vw2->weights.dense_weights);
  }

  VW_ReleaseFeatureSpace(fs, 2);

  VW_Finish(handle1);
  VW_Finish(handle2);
}